

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_heap_sift_down(int **dst,size_t start,size_t end)

{
  int *piVar1;
  size_t child;
  ulong uVar2;
  int *_sort_swap_temp;
  size_t root;
  
  while( true ) {
    uVar2 = start * 2;
    if (end < uVar2) {
      return;
    }
    if ((uVar2 < end) && (*dst[start * 2] < *dst[start * 2 + 1])) {
      uVar2 = uVar2 | 1;
    }
    piVar1 = dst[start];
    if (*dst[uVar2] <= *piVar1) break;
    dst[start] = dst[uVar2];
    dst[uVar2] = piVar1;
    start = uVar2;
  }
  return;
}

Assistant:

static __inline void HEAP_SIFT_DOWN(SORT_TYPE *dst, const size_t start,
                                    const size_t end) {
  size_t root = start;

  while ((root << 1) <= end) {
    size_t child = root << 1;

    if ((child < end) && (SORT_CMP(dst[child], dst[child + 1]) < 0)) {
      child++;
    }

    if (SORT_CMP(dst[root], dst[child]) < 0) {
      SORT_SWAP(dst[root], dst[child]);
      root = child;
    } else {
      return;
    }
  }
}